

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

String * kj::_::operator*(String *__return_storage_ptr__,long param_2,undefined8 param_3,
                         undefined8 param_4,StringPtr *param_5)

{
  long lVar1;
  undefined8 uVar2;
  long local_48;
  undefined8 uStack_40;
  undefined8 *local_38;
  StringPtr local_28;
  
  operator*<double>(&local_48);
  local_28.content.ptr = "(can\'t stringify)";
  local_28.content.size_ = 0x12;
  concat<kj::String,kj::StringPtr&,kj::StringPtr>
            (__return_storage_ptr__,(_ *)&local_48,(String *)(param_2 + 0x18),&local_28,param_5);
  uVar2 = uStack_40;
  lVar1 = local_48;
  if (local_48 != 0) {
    local_48 = 0;
    uStack_40 = 0;
    (**(code **)*local_38)(local_38,lVar1,1,uVar2,uVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}